

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseEntryMid
          (Status *__return_storage_ptr__,JsonStreamParser *this,TokenType type)

{
  StringPiece local_48;
  StringPiece local_38;
  ParseType local_24;
  
  if (type == ENTRY_SEPARATOR) {
    Advance(this);
    local_24 = VALUE;
    std::
    deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ::emplace_back<google::protobuf::util::converter::JsonStreamParser::ParseType>
              (&(this->stack_).c,&local_24);
    Status::Status(__return_storage_ptr__);
  }
  else if (type == UNKNOWN) {
    StringPiece::StringPiece(&local_48,"Expected : between key:value pair.");
    ReportUnknown(__return_storage_ptr__,this,local_48);
  }
  else {
    StringPiece::StringPiece(&local_38,"Expected : between key:value pair.");
    ReportFailure(__return_storage_ptr__,this,local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseEntryMid(TokenType type) {
  if (type == UNKNOWN) {
    return ReportUnknown("Expected : between key:value pair.");
  }
  if (type == ENTRY_SEPARATOR) {
    Advance();
    stack_.push(VALUE);
    return util::Status();
  }
  return ReportFailure("Expected : between key:value pair.");
}